

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::End(void)

{
  ImVector<ImGuiWindowStackData> *this;
  ImVec2 IVar1;
  int iVar2;
  ImGuiWindow_conflict *pIVar3;
  ImVec2 IVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ImGuiID IVar9;
  ImGuiItemFlags IVar10;
  ImGuiContext_conflict1 *pIVar11;
  ImGuiItemStatusFlags IVar12;
  float fVar13;
  uint uVar14;
  ImGuiWindowStackData_conflict *pIVar15;
  ImGuiWindow_conflict *pIVar16;
  
  pIVar11 = GImGui;
  pIVar16 = GImGui->CurrentWindow;
  iVar2 = (GImGui->CurrentWindowStack).Size;
  if (iVar2 < 2) {
    if (GImGui->WithinFrameScopeWithImplicitWindow == true) {
      __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x1b28,"void ImGui::End()");
    }
    if (iVar2 != 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x1b2b,"void ImGui::End()");
    }
  }
  uVar14 = pIVar16->Flags;
  if ((((uVar14 & 0x21000000) == 0x1000000) && ((pIVar16->field_0x3e1 & 1) == 0)) &&
     (GImGui->WithinEndChild == false)) {
    __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x1b2f,"void ImGui::End()");
  }
  if ((pIVar16->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    EndColumns();
    uVar14 = pIVar16->Flags;
  }
  if ((uVar14 >> 0x1d & 1) == 0) {
    PopClipRect();
    uVar14 = pIVar16->Flags;
  }
  if ((uVar14 >> 0x18 & 1) == 0) {
    LogFinish();
  }
  this = &pIVar11->CurrentWindowStack;
  if (((pIVar16->DockNode != (ImGuiDockNode *)0x0) && ((pIVar16->field_0x3e1 & 4) != 0)) &&
     (pIVar3 = pIVar16->DockNode->HostWindow, pIVar3 != (ImGuiWindow_conflict *)0x0)) {
    IVar1 = (pIVar16->DC).CursorMaxPos;
    IVar4.y = (IVar1.y + (pIVar16->WindowPadding).y) - (pIVar3->WindowPadding).y;
    IVar4.x = (IVar1.x + (pIVar16->WindowPadding).x) - (pIVar3->WindowPadding).x;
    (pIVar3->DC).CursorMaxPos = IVar4;
  }
  pIVar15 = ImVector<ImGuiWindowStackData>::back(this);
  IVar9 = (pIVar15->ParentLastItemDataBackup).ID;
  IVar10 = (pIVar15->ParentLastItemDataBackup).InFlags;
  IVar12 = (pIVar15->ParentLastItemDataBackup).StatusFlags;
  fVar13 = (pIVar15->ParentLastItemDataBackup).Rect.Min.x;
  uVar5 = *(undefined8 *)&(pIVar15->ParentLastItemDataBackup).Rect.Min.y;
  uVar6 = *(undefined8 *)&(pIVar15->ParentLastItemDataBackup).Rect.Max.y;
  uVar7 = *(undefined8 *)&(pIVar15->ParentLastItemDataBackup).NavRect.Min.y;
  uVar8 = *(undefined8 *)&(pIVar15->ParentLastItemDataBackup).NavRect.Max.y;
  IVar1 = (pIVar15->ParentLastItemDataBackup).DisplayRect.Max;
  (pIVar11->LastItemData).DisplayRect.Min = (pIVar15->ParentLastItemDataBackup).DisplayRect.Min;
  (pIVar11->LastItemData).DisplayRect.Max = IVar1;
  *(undefined8 *)&(pIVar11->LastItemData).NavRect.Min.y = uVar7;
  *(undefined8 *)&(pIVar11->LastItemData).NavRect.Max.y = uVar8;
  *(undefined8 *)&(pIVar11->LastItemData).Rect.Min.y = uVar5;
  *(undefined8 *)&(pIVar11->LastItemData).Rect.Max.y = uVar6;
  (pIVar11->LastItemData).ID = IVar9;
  (pIVar11->LastItemData).InFlags = IVar10;
  (pIVar11->LastItemData).StatusFlags = IVar12;
  (pIVar11->LastItemData).Rect.Min.x = fVar13;
  if ((pIVar16->Flags & 0x4000000) != 0) {
    ImVector<ImGuiPopupData>::pop_back(&pIVar11->BeginPopupStack);
  }
  pIVar15 = ImVector<ImGuiWindowStackData>::back(this);
  ImGuiStackSizes::CompareWithCurrentState(&pIVar15->StackSizesOnBegin);
  ImVector<ImGuiWindowStackData>::pop_back(this);
  if (this->Size == 0) {
    pIVar16 = (ImGuiWindow_conflict *)0x0;
  }
  else {
    pIVar15 = ImVector<ImGuiWindowStackData>::back(this);
    pIVar16 = pIVar15->Window;
  }
  SetCurrentWindow(pIVar16);
  if (pIVar11->CurrentWindow != (ImGuiWindow_conflict *)0x0) {
    SetCurrentViewport(pIVar16,pIVar11->CurrentWindow->Viewport);
    return;
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !(window->Flags & ImGuiWindowFlags_DockNodeHost) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.LastItemData = g.CurrentWindowStack.back().ParentLastItemDataBackup;
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    g.CurrentWindowStack.back().StackSizesOnBegin.CompareWithCurrentState();
    g.CurrentWindowStack.pop_back();
    SetCurrentWindow(g.CurrentWindowStack.Size == 0 ? NULL : g.CurrentWindowStack.back().Window);
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}